

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableFieldGetter(CppGenerator *this,FieldDef *field)

{
  undefined8 type_00;
  bool bVar1;
  bool bVar2;
  char *afterptr_00;
  allocator<char> local_4b9;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> opt_value;
  string face_type;
  string wire_type;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  undefined1 local_178 [8];
  string afterptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> call;
  string offset_type;
  string local_90 [8];
  string offset_size;
  string accessor;
  bool is_scalar;
  undefined1 local_40 [8];
  string offset_str;
  Type *type;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  offset_str.field_2._8_8_ = &field->value;
  GenFieldOffsetName_abi_cxx11_((string *)local_40,this,field);
  GenComment(this,&(field->super_Definition).doc_comment,"  ");
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_
              ((string *)((long)&face_type.field_2 + 8),this,(Type *)offset_str.field_2._8_8_,false)
    ;
    GenTypeBasic_abi_cxx11_
              ((string *)((long)&opt_value.field_2 + 8),this,(Type *)offset_str.field_2._8_8_,true);
    std::operator+(&local_3e8,"GetOptional<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&face_type.field_2 + 8));
    std::operator+(&local_3c8,&local_3e8,", ");
    std::operator+(&local_3a8,&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&opt_value.field_2 + 8));
    std::operator+(&local_388,&local_3a8,">(");
    std::operator+(&local_368,&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                   &local_368,")");
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"FIELD_TYPE",&local_409)
    ;
    GenOptionalDecl_abi_cxx11_(&local_430,this,(Type *)offset_str.field_2._8_8_);
    CodeWriter::SetValue(&this->code_,&local_408,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,"  {{FIELD_TYPE}} {{FIELD_NAME}}() const {",&local_451);
    CodeWriter::operator+=(&this->code_,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::operator+(&local_498,"    return ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
    std::operator+(&local_478,&local_498,";");
    CodeWriter::operator+=(&this->code_,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"  }",&local_4b9);
    CodeWriter::operator+=(&this->code_,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)local_348);
    std::__cxx11::string::~string((string *)(opt_value.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(face_type.field_2._M_local_buf + 8));
  }
  else {
    bVar1 = IsScalar(*(BaseType *)offset_str.field_2._8_8_);
    std::__cxx11::string::string((string *)(offset_size.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,"",(allocator<char> *)(offset_type.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(offset_type.field_2._M_local_buf + 0xf));
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(offset_size.field_2._M_local_buf + 8),"GetField<");
    }
    else {
      bVar2 = IsStruct((Type *)offset_str.field_2._8_8_);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(offset_size.field_2._M_local_buf + 8),"GetStruct<");
      }
      else if ((field->offset64 & 1U) == 0) {
        std::__cxx11::string::operator=
                  ((string *)(offset_size.field_2._M_local_buf + 8),"GetPointer<");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(offset_size.field_2._M_local_buf + 8),"GetPointer64<");
      }
    }
    GenTypeGet_abi_cxx11_
              ((string *)((long)&call.field_2 + 8),this,(Type *)offset_str.field_2._8_8_,"","const "
               ," *",false);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&offset_size.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&call.field_2 + 8));
    std::operator+(&local_f8,&local_118,">(");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    if (bVar1) {
      GenDefaultConstant_abi_cxx11_((string *)((long)&afterptr.field_2 + 8),this,field);
      std::operator+(&local_138,", ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&afterptr.field_2 + 8));
      std::__cxx11::string::operator+=((string *)local_d8,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)(afterptr.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator+=((string *)local_d8,")");
    NullableExtension_abi_cxx11_(&local_198,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                   " *",&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"FIELD_TYPE",&local_1b9)
    ;
    type_00 = offset_str.field_2._8_8_;
    afterptr_00 = (char *)std::__cxx11::string::c_str();
    GenTypeGet_abi_cxx11_(&local_1e0,this,(Type *)type_00," ","const ",afterptr_00,true);
    CodeWriter::SetValue(&this->code_,&local_1b8,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"FIELD_VALUE",&local_201);
    GenUnderlyingCast(&local_228,this,field,true,(string *)local_d8);
    CodeWriter::SetValue(&this->code_,&local_200,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,"NULLABLE_EXT",&local_249);
    NullableExtension_abi_cxx11_(&local_270,this);
    CodeWriter::SetValue(&this->code_,&local_248,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"  {{FIELD_TYPE}}{{FIELD_NAME}}() const {",&local_291);
    CodeWriter::operator+=(&this->code_,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"    return {{FIELD_VALUE}};",&local_2b9);
    CodeWriter::operator+=(&this->code_,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"  }",(allocator<char> *)(wire_type.field_2._M_local_buf + 0xf))
    ;
    CodeWriter::operator+=(&this->code_,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)(wire_type.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)(call.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)(offset_size.field_2._M_local_buf + 8));
  }
  if (*(int *)offset_str.field_2._8_8_ == 0x10) {
    GenTableUnionAsGetters(this,field);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void GenTableFieldGetter(const FieldDef &field) {
    const auto &type = field.value.type;
    const auto offset_str = GenFieldOffsetName(field);

    GenComment(field.doc_comment, "  ");
    // Call a different accessor for pointers, that indirects.
    if (!field.IsScalarOptional()) {
      const bool is_scalar = IsScalar(type.base_type);
      std::string accessor;
      std::string offset_size = "";
      if (is_scalar) {
        accessor = "GetField<";
      } else if (IsStruct(type)) {
        accessor = "GetStruct<";
      } else {
        if (field.offset64) {
          accessor = "GetPointer64<";
        } else {
          accessor = "GetPointer<";
        }
      }
      auto offset_type = GenTypeGet(type, "", "const ", " *", false);
      auto call = accessor + offset_type + ">(" + offset_str;
      // Default value as second arg for non-pointer types.
      if (is_scalar) { call += ", " + GenDefaultConstant(field); }
      call += ")";

      std::string afterptr = " *" + NullableExtension();
      code_.SetValue("FIELD_TYPE",
                     GenTypeGet(type, " ", "const ", afterptr.c_str(), true));
      code_.SetValue("FIELD_VALUE", GenUnderlyingCast(field, true, call));
      code_.SetValue("NULLABLE_EXT", NullableExtension());
      code_ += "  {{FIELD_TYPE}}{{FIELD_NAME}}() const {";
      code_ += "    return {{FIELD_VALUE}};";
      code_ += "  }";
    } else {
      auto wire_type = GenTypeBasic(type, false);
      auto face_type = GenTypeBasic(type, true);
      auto opt_value = "GetOptional<" + wire_type + ", " + face_type + ">(" +
                       offset_str + ")";
      code_.SetValue("FIELD_TYPE", GenOptionalDecl(type));
      code_ += "  {{FIELD_TYPE}} {{FIELD_NAME}}() const {";
      code_ += "    return " + opt_value + ";";
      code_ += "  }";
    }

    if (type.base_type == BASE_TYPE_UNION) { GenTableUnionAsGetters(field); }
  }